

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::writeHeader(MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QTextStream *pQVar2;
  qsizetype qVar3;
  QTextStream *in_RSI;
  MakefileGenerator *in_RDI;
  long in_FS_OFFSET;
  QString ofile;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000034c;
  QMakeProject *in_stack_fffffffffffffde8;
  QTextStream *in_stack_fffffffffffffdf0;
  CaseSensitivity cs;
  code *s;
  QMakeProject *in_stack_fffffffffffffdf8;
  QString *pQVar4;
  QString *in_stack_fffffffffffffe00;
  QTextStream *in_stack_fffffffffffffe08;
  undefined1 local_1a8 [48];
  undefined8 local_178;
  undefined8 in_stack_fffffffffffffe90;
  undefined1 canon;
  QString *in_stack_fffffffffffffe98;
  MakefileGenerator *in_stack_fffffffffffffea0;
  undefined1 local_148 [48];
  undefined1 local_118 [48];
  undefined1 local_e8 [48];
  undefined1 local_b8 [56];
  undefined1 local_80 [24];
  undefined1 local_68 [48];
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  canon = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<
            (in_RSI,
             "#############################################################################\n");
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"# Makefile for building: ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  (*(in_RDI->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(local_38,in_RDI,local_68);
  (*(in_RDI->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(local_20,in_RDI,local_38);
  QTextStream::operator<<(pQVar2,(QString *)local_20);
  ::operator<<(in_stack_fffffffffffffdf0,(QTextStreamFunction)in_stack_fffffffffffffde8);
  QString::~QString((QString *)0x184e12);
  QString::~QString((QString *)0x184e1f);
  ProKey::~ProKey((ProKey *)0x184e2c);
  QTextStream::operator<<(in_RSI,"# Generated by qmake (3.1) (Qt 6.10.0)\n");
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"# Project:  ");
  QMakeProject::projectFile(in_stack_fffffffffffffde8);
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffdf0,
             (FileFixifyType)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  fileFixify(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (FileFixifyTypes)in_stack_0000034c.i,(bool)canon);
  QTextStream::operator<<(pQVar2,(QString *)local_80);
  ::operator<<(in_stack_fffffffffffffdf0,(QTextStreamFunction)in_stack_fffffffffffffde8);
  QString::~QString((QString *)0x184ed3);
  QString::~QString((QString *)0x184ee0);
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"# Template: ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  (*(in_RDI->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(local_b8,in_RDI,local_e8);
  QTextStream::operator<<(pQVar2,(QString *)local_b8);
  ::operator<<(in_stack_fffffffffffffdf0,(QTextStreamFunction)in_stack_fffffffffffffde8);
  QString::~QString((QString *)0x184f56);
  ProKey::~ProKey((ProKey *)0x184f63);
  QString::QString((QString *)in_stack_fffffffffffffdf8,(char *)pQVar2);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_fffffffffffffdf8,(QString *)in_stack_fffffffffffffdf0,
                     SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
  QString::~QString((QString *)0x184faf);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffe08 = (QTextStream *)QTextStream::operator<<(in_RSI,"# Command: ");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
    (*(in_RDI->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
              (local_118,in_RDI,local_148);
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_stack_fffffffffffffe08,(QString *)local_118);
    fullBuildArgs(in_RDI);
    QTextStream::operator<<(pQVar2,(QString *)&stack0xfffffffffffffea0);
    ::operator<<(in_stack_fffffffffffffdf0,(QTextStreamFunction)in_stack_fffffffffffffde8);
    QString::~QString((QString *)0x18505b);
    QString::~QString((QString *)0x185068);
    ProKey::~ProKey((ProKey *)0x185075);
  }
  QTextStream::operator<<
            (in_RSI,
             "#############################################################################\n");
  ::operator<<(in_stack_fffffffffffffdf0,(QTextStreamFunction)in_stack_fffffffffffffde8);
  cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  local_178 = 0xaaaaaaaaaaaaaaaa;
  QFile::fileName();
  Option::fixPathToTargetOS
            ((QString *)in_stack_fffffffffffffe08,SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffe00 >> 0x30,0));
  QString::~QString((QString *)0x185101);
  qVar3 = QString::lastIndexOf(in_stack_fffffffffffffe00,(QString *)in_stack_fffffffffffffdf8,cs);
  if (qVar3 != -1) {
    QString::lastIndexOf(in_stack_fffffffffffffe00,(QString *)in_stack_fffffffffffffdf8,cs);
    QString::remove((longlong)&local_178,0);
  }
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"MAKEFILE      = ");
  pQVar4 = (QString *)local_1a8;
  (*(in_RDI->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])();
  QTextStream::operator<<(pQVar2,pQVar4);
  s = Qt::endl;
  ::operator<<((QTextStream *)Qt::endl,(QTextStreamFunction)pQVar2);
  ::operator<<((QTextStream *)s,(QTextStreamFunction)pQVar2);
  QString::~QString((QString *)0x1851c4);
  QTextStream::operator<<(in_RSI,"EQ            = =\n\n");
  QString::~QString((QString *)0x1851df);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeHeader(QTextStream &t)
{
    t << "#############################################################################\n";
    t << "# Makefile for building: " << escapeFilePath(var("TARGET")) << Qt::endl;
    t << "# Generated by qmake (" QMAKE_VERSION_STR ") (Qt " QT_VERSION_STR ")\n";
    t << "# Project:  " << fileFixify(project->projectFile()) << Qt::endl;
    t << "# Template: " << var("TEMPLATE") << Qt::endl;
    if(!project->isActiveConfig("build_pass"))
        t << "# Command: " << var("QMAKE_QMAKE") << fullBuildArgs() << Qt::endl;
    t << "#############################################################################\n";
    t << Qt::endl;
    QString ofile = Option::fixPathToTargetOS(Option::output.fileName());
    if (ofile.lastIndexOf(Option::dir_sep) != -1)
        ofile.remove(0, ofile.lastIndexOf(Option::dir_sep) +1);
    t << "MAKEFILE      = " << escapeFilePath(ofile) << Qt::endl << Qt::endl;
    t << "EQ            = =\n\n";
}